

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cpp
# Opt level: O3

void __thiscall
ANN::NearestNeighbor
          (ANN *this,int *topology,ANNpoint scaling,ANNpoint *x,int NumNeighbors,ANNpoint *d_best,
          int **n_best)

{
  double __x;
  int iVar1;
  ANNpoint pAVar2;
  ANNpoint pAVar3;
  long lVar4;
  ulong uVar5;
  ANNcoord AVar6;
  
  iVar1 = this->dimension;
  if ((long)iVar1 < 1) {
    pAVar3 = this->query_pt;
  }
  else {
    pAVar2 = *x;
    pAVar3 = this->query_pt;
    lVar4 = 0;
    do {
      pAVar3[lVar4] = scaling[lVar4] * pAVar2[lVar4];
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  (*(this->the_tree->super_ANNpointSet)._vptr_ANNpointSet[2])
            (this->epsilon,this->the_tree,pAVar3,(ulong)(uint)NumNeighbors,this->nn_idx,this->dists)
  ;
  if (0 < NumNeighbors) {
    uVar5 = 0;
    do {
      (*n_best)[uVar5] = this->node_indices[this->nn_idx[uVar5]];
      __x = this->dists[uVar5];
      if (__x < 0.0) {
        AVar6 = sqrt(__x);
      }
      else {
        AVar6 = SQRT(__x);
      }
      (*d_best)[uVar5] = AVar6;
      uVar5 = uVar5 + 1;
    } while ((uint)NumNeighbors != uVar5);
  }
  return;
}

Assistant:

void ANN::NearestNeighbor(int *topology, ANNpoint scaling, const ANNpoint &x,
                          int NumNeighbors, ANNpoint &d_best, int *&n_best) {
    int i;

    // Transfer x to query_pt
    for (i = 0; i < dimension; i++) {
        query_pt[i] = scaling[i] * x[i];
    }

    the_tree->annkSearch(query_pt,      // query point
                         NumNeighbors,  // number of near neighbors
                         nn_idx,        // nearest neighbors (returned)
                         dists,         // distance (returned)
                         epsilon);      // error bound

    for (i = 0; i < NumNeighbors; i++) {
        n_best[i] = node_indices[nn_idx[i]];
        d_best[i] = sqrt(dists[i]);
    }
}